

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

void RigidBodyDynamics::Utils::CalcZeroMomentPoint
               (Model *model,VectorNd *q,VectorNd *qdot,VectorNd *qddot,Vector3d *zmp,
               Vector3d *normal,Vector3d *point,bool update_kinematics)

{
  uint uVar1;
  undefined8 uVar2;
  SpatialRigidBodyInertia *pSVar3;
  reference pvVar4;
  Scalar *startRow;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
  *other;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_R8;
  byte in_stack_00000010;
  Vector3d f;
  Vector3d n_0;
  SpatialTransform Xcom;
  Vector3d com;
  Scalar mass;
  uint lambda;
  size_t i_1;
  SpatialVector hdot_tot;
  SpatialVector h_tot;
  SpatialRigidBodyInertia I_tot;
  size_t i;
  SpatialRigidBodyInertia *in_stack_fffffffffffff768;
  SpatialRigidBodyInertia *in_stack_fffffffffffff770;
  Scalar in_stack_fffffffffffff778;
  SpatialRigidBodyInertia *in_stack_fffffffffffff780;
  string *in_stack_fffffffffffff788;
  reference in_stack_fffffffffffff790;
  reference in_stack_fffffffffffff798;
  allocator<char> *in_stack_fffffffffffff7a0;
  double *in_stack_fffffffffffff7a8;
  reference in_stack_fffffffffffff7b0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff7b8;
  Vector3_t *in_stack_fffffffffffff7c0;
  reference in_stack_fffffffffffff7c8;
  reference in_stack_fffffffffffff7d0;
  reference in_stack_fffffffffffff7d8;
  reference in_stack_fffffffffffff7e0;
  reference in_stack_fffffffffffff7e8;
  SpatialRigidBodyInertia *rbi;
  SpatialRigidBodyInertia *in_stack_fffffffffffff7f8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff800;
  SpatialTransform *in_stack_fffffffffffff808;
  SpatialVector *in_stack_fffffffffffff8a0;
  SpatialVector *in_stack_fffffffffffff8a8;
  SpatialVector *in_stack_fffffffffffff8f0;
  SpatialTransform *in_stack_fffffffffffff8f8;
  SpatialVector *in_stack_fffffffffffff930;
  SpatialTransform *in_stack_fffffffffffff938;
  SpatialVector *in_stack_fffffffffffff990;
  SpatialRigidBodyInertia *in_stack_fffffffffffff998;
  SpatialRigidBodyInertia *in_stack_fffffffffffffae8;
  SpatialTransform *in_stack_fffffffffffffaf0;
  VectorNd *in_stack_fffffffffffffb78;
  VectorNd *in_stack_fffffffffffffb80;
  VectorNd *in_stack_fffffffffffffb88;
  Model *in_stack_fffffffffffffb90;
  size_type local_290;
  SpatialRigidBodyInertia *local_78;
  
  if (in_R8 != 0) {
    if ((in_stack_00000010 & 1) != 0) {
      UpdateKinematicsCustom
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    }
    local_78 = (SpatialRigidBodyInertia *)0x1;
    while (rbi = local_78,
          pSVar3 = (SpatialRigidBodyInertia *)
                   std::
                   vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                           *)&in_RDI[0x21].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish), rbi < pSVar3) {
      in_stack_fffffffffffff7d0 =
           std::
           vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                         *)(in_RDI + 0x1a),(size_type)local_78);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1b),(size_type)local_78);
      Math::SpatialRigidBodyInertia::operator=(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      in_stack_fffffffffffff7d8 =
           std::
           vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                         *)(in_RDI + 0x1b),(size_type)local_78);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(size_type)local_78);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
      in_stack_fffffffffffff7e8 =
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)local_78);
      in_stack_fffffffffffff7e0 =
           std::
           vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                         *)(in_RDI + 0x1b),(size_type)local_78);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(size_type)local_78);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
      Math::crossf(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff798,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff790);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RDI + 0x1d),(size_type)local_78);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffff770,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)in_stack_fffffffffffff768);
      local_78 = (SpatialRigidBodyInertia *)((long)&local_78->m + 1);
    }
    Vector3_t::Vector3_t
              (in_stack_fffffffffffff7c0,(double *)in_stack_fffffffffffff7b8,
               (double *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
    Matrix3_t::
    Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix3_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)in_stack_fffffffffffff768);
    Math::SpatialRigidBodyInertia::SpatialRigidBodyInertia
              (in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (Vector3d *)in_stack_fffffffffffff770,(Matrix3d *)in_stack_fffffffffffff768);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
    SpatialVector_t::
    SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
              ((SpatialVector_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)in_stack_fffffffffffff768);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
    SpatialVector_t::
    SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
              ((SpatialVector_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)in_stack_fffffffffffff768);
    local_290 = std::
                vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                        *)&in_RDI[0x21].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
    while (local_290 = local_290 - 1, local_290 != 0) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,local_290);
      uVar1 = *pvVar4;
      if (uVar1 == 0) {
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1e),local_290);
        std::
        vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                      *)(in_RDI + 0x1b),local_290);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        Math::SpatialRigidBodyInertia::operator+(in_stack_fffffffffffff7f8,rbi);
        Math::SpatialRigidBodyInertia::operator=
                  (in_stack_fffffffffffff770,in_stack_fffffffffffff768);
        in_stack_fffffffffffff790 =
             std::
             vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           *)(in_RDI + 0x1e),local_290);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RDI + 0x1c),local_290);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff798,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff790);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff770,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffff768);
        in_stack_fffffffffffff798 =
             std::
             vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           *)(in_RDI + 0x1e),local_290);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RDI + 0x1d),local_290);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff798,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff790);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff770,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffff768);
      }
      else {
        std::
        vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                      *)(in_RDI + 0x1b),(ulong)uVar1);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1e),local_290);
        std::
        vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                      *)(in_RDI + 0x1b),local_290);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        Math::SpatialRigidBodyInertia::operator+(in_stack_fffffffffffff7f8,rbi);
        std::
        vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                      *)(in_RDI + 0x1b),(ulong)uVar1);
        Math::SpatialRigidBodyInertia::operator=
                  (in_stack_fffffffffffff770,in_stack_fffffffffffff768);
        in_stack_fffffffffffff7b8 =
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        (in_RDI + 0x1c),(ulong)uVar1);
        in_stack_fffffffffffff7b0 =
             std::
             vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           *)(in_RDI + 0x1e),local_290);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RDI + 0x1c),local_290);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff798,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff790);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RDI + 0x1c),(ulong)uVar1);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff770,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffff768);
        in_stack_fffffffffffff7c8 =
             std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                       ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                        (in_RDI + 0x1d),(ulong)uVar1);
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x1e),local_290);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RDI + 0x1d),local_290);
        Math::SpatialTransform::applyTranspose(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
        Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff798,
                   (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff790);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   (in_RDI + 0x1d),(ulong)uVar1);
        SpatialVector_t::operator=
                  ((SpatialVector_t *)in_stack_fffffffffffff770,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)in_stack_fffffffffffff768);
      }
    }
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffff7b8,(double *)in_stack_fffffffffffff7b0);
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Vector3_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff768);
    Math::Xtrans((Vector3d *)in_stack_fffffffffffff7c8);
    Math::SpatialTransform::applyAdjoint(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffff770,
               (SpatialVector_t *)in_stack_fffffffffffff768);
    startRow = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff770,(Index)in_stack_fffffffffffff768);
    this = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff770,(Index)in_stack_fffffffffffff768);
    other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
             *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff770,(Index)in_stack_fffffffffffff768);
    SpatialVector_t::SpatialVector_t
              ((SpatialVector_t *)rbi,(double *)in_stack_fffffffffffff7e8,
               &in_stack_fffffffffffff7e0->m,&in_stack_fffffffffffff7d8->m,
               &in_stack_fffffffffffff7d0->m,(double *)in_stack_fffffffffffff7c8,
               (double *)in_stack_fffffffffffff800);
    Eigen::operator*((double *)in_stack_fffffffffffff7b8,
                     (StorageBaseType *)in_stack_fffffffffffff7b0);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffff798,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)in_stack_fffffffffffff790);
    SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffff770,other);
    Math::SpatialTransform::inverse(in_stack_fffffffffffff808);
    Math::SpatialTransform::applyAdjoint(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffff770,(SpatialVector_t *)other);
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
              (this,(Index)startRow,(Index)in_stack_fffffffffffff770);
    Vector3_t::Vector3_t<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
              ((Vector3_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_> *)other
              );
    Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
              (this,(Index)startRow,(Index)in_stack_fffffffffffff770);
    Vector3_t::Vector3_t<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
              ((Vector3_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_> *)other
              );
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff808,
               in_stack_fffffffffffff800);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffff7b8,(double *)in_stack_fffffffffffff7b0);
    Vector3_t::operator=
              ((Vector3_t *)in_stack_fffffffffffff770,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)other);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7b0,(char *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  Errors::RBDLError::RBDLError((RBDLError *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  __cxa_throw(uVar2,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

RBDL_DLLAPI void CalcZeroMomentPoint (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  const Math::VectorNd &qddot,
  Vector3d* zmp,
  const Math::Vector3d &normal,
  const Math::Vector3d &point,
  bool update_kinematics
)
{
  if (zmp == NULL) {
    throw Errors::RBDLError("ZMP (output) is 'NULL'!\n");
  }

  // update kinematics if required
  // NOTE UpdateKinematics computes model.a[i] and model.v[i] required for
  //      change of momentum
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, &qddot);
  }

  // compute change of momentum of each single body (same as in RNEA/InverseDynamics)
  for (size_t i = 1; i < model.mBodies.size(); i++) {
    model.Ic[i] = model.I[i];
    model.hdotc[i] = model.Ic[i] * model.a[i] + crossf(model.v[i],
                     model.Ic[i] * model.v[i]);
  }

  SpatialRigidBodyInertia I_tot (0., Vector3d (0., 0., 0.), Matrix3d::Zero());
  SpatialVector h_tot (SpatialVector::Zero());
  SpatialVector hdot_tot (SpatialVector::Zero());

  // compute total change of momentum and CoM wrt to root body (idx = 0)
  // by recursively summing up local change of momentum
  for (size_t i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int lambda = model.lambda[i];

    if (lambda != 0) {
      model.Ic[lambda] = model.Ic[lambda] + model.X_lambda[i].applyTranspose (
                           model.Ic[i]);
      model.hc[lambda] = model.hc[lambda] + model.X_lambda[i].applyTranspose (
                           model.hc[i]);
      model.hdotc[lambda] = model.hdotc[lambda] + model.X_lambda[i].applyTranspose (
                              model.hdotc[i]);
    } else {
      I_tot = I_tot + model.X_lambda[i].applyTranspose (model.Ic[i]);
      h_tot = h_tot + model.X_lambda[i].applyTranspose (model.hc[i]);
      hdot_tot = hdot_tot + model.X_lambda[i].applyTranspose (model.hdotc[i]);
    }
  }

  // compute CoM from mass and total inertia
  const Scalar mass = I_tot.m;
  const Vector3d com = I_tot.h / mass;

  // project angular momentum onto CoM
  SpatialTransform Xcom = Xtrans (com);
  hdot_tot = Xcom.applyAdjoint (hdot_tot);

  // compute net external force at CoM by removing effects due to gravity
  hdot_tot = hdot_tot - mass * SpatialVector (0., 0., 0., model.gravity[0],
             model.gravity[1], model.gravity[2]);

  // express total change of momentum in world coordinates
  hdot_tot = Xcom.inverse().applyAdjoint (hdot_tot);

  // project purified change of momentum onto surface
  // z = n x n_0
  //     -------
  //     n * f
  Vector3d n_0 = hdot_tot.block<3,1>(0,0);
  Vector3d f = hdot_tot.block<3,1>(3,0);
  *zmp = normal.cross(n_0) / normal.dot(f);

  // double distance = (hdot_tot - point).dot(normal);
  // zmp = hdot_tot - distance * normal;

  return;
}